

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O2

int move_gain(CHAR_DATA *ch)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  
  if (ch->in_room == (ROOM_INDEX_DATA *)0x0) {
    return 0;
  }
  bVar1 = is_affected(ch,(int)gsn_atrophy);
  if (bVar1) {
    return 0;
  }
  bVar1 = is_affected(ch,(int)gsn_prevent_healing);
  if (bVar1) {
    return 0;
  }
  bVar1 = is_npc(ch);
  if (!bVar1) {
    if (6 < ch->pcdata->condition[4]) {
      return 5;
    }
    if (4 < ch->pcdata->condition[5]) {
      return 5;
    }
  }
  bVar1 = is_npc(ch);
  uVar7 = (uint)ch->level;
  if (bVar1) goto LAB_00318a2d;
  uVar2 = ch->level / 2;
  uVar5 = 0xf;
  if (0xf < (short)uVar2) {
    uVar5 = uVar2;
  }
  uVar6 = (uint)uVar5;
  if (ch->position == 5) {
    iVar3 = get_curr_stat(ch,3);
    iVar3 = iVar3 / 2;
LAB_003189fc:
    uVar6 = (uint)uVar5 + iVar3;
  }
  else if (ch->position == 4) {
    iVar3 = get_curr_stat(ch,3);
    goto LAB_003189fc;
  }
  bVar1 = is_hungry(ch);
  uVar7 = (int)uVar6 / 2;
  if (!bVar1) {
    uVar7 = uVar6;
  }
  bVar1 = is_thirsty(ch);
  if (bVar1) {
    uVar7 = (int)uVar7 / 2;
  }
LAB_00318a2d:
  iVar3 = (int)(ch->in_room->heal_rate / 100) * uVar7;
  if ((ch->on != (OBJ_DATA *)0x0) && (ch->on->item_type == 0xc)) {
    iVar3 = (iVar3 * 6) / 5;
  }
  bVar1 = is_affected_by(ch,0xc);
  iVar4 = iVar3 / 4;
  if (!bVar1) {
    iVar4 = iVar3;
  }
  bVar1 = is_affected_by(ch,0x17);
  iVar3 = iVar4 / 8;
  if (!bVar1) {
    iVar3 = iVar4;
  }
  bVar1 = is_affected_by(ch,0x15);
  if ((bVar1) || (bVar1 = is_affected_by(ch,0x1d), bVar1)) {
    iVar3 = iVar3 * 2;
  }
  bVar1 = is_affected(ch,(int)gsn_camp);
  if (bVar1) {
    iVar4 = number_percent();
    iVar3 = iVar3 << (iVar4 < ch->pcdata->learned[gsn_camp]);
  }
  iVar4 = (int)ch->max_move - (int)ch->move;
  if (SBORROW4(iVar4,iVar3 * 2) == iVar4 + iVar3 * -2 < 0) {
    iVar4 = iVar3 * 2;
  }
  return iVar4;
}

Assistant:

int move_gain(CHAR_DATA *ch)
{
	int gain;

	if (ch->in_room == nullptr)
		return 0;

	if (is_affected(ch, gsn_atrophy) || is_affected(ch, gsn_prevent_healing))
		return 0;

	if (!is_npc(ch))
	{
		if (ch->pcdata->condition[COND_STARVING] > 6)
			return 5;

		if (ch->pcdata->condition[COND_DEHYDRATED] > 4)
			return 5;
	}

	if (is_npc(ch))
	{
		gain = ch->level;
	}
	else
	{
		gain = std::max(15, ch->level / 2);

		switch (ch->position)
		{
			case POS_SLEEPING:
				gain += get_curr_stat(ch, STAT_DEX);
				break;
			case POS_RESTING:
				gain += get_curr_stat(ch, STAT_DEX) / 2;
				break;
		}

		if (is_hungry(ch))
			gain /= 2;

		if (is_thirsty(ch))
			gain /= 2;
	}

	gain *= ch->in_room->heal_rate / 100;

	if (ch->on != nullptr && ch->on->item_type == ITEM_FURNITURE)
		gain = gain * 6 / 5;

	if (is_affected_by(ch, AFF_POISON))
		gain /= 4;

	if (is_affected_by(ch, AFF_PLAGUE))
		gain /= 8;

	if (is_affected_by(ch, AFF_HASTE) || is_affected_by(ch, AFF_SLOW))
		gain *= 2;

	if (is_affected(ch, gsn_camp))
	{
		if (number_percent() < ch->pcdata->learned[gsn_camp])
			gain *= 2;
	}
	gain *= 2;
	return std::min(gain, (int)(ch->max_move - ch->move));
}